

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O2

LIndex IndexTools::IndividualToJointIndicesArrayStepSize
                 (LIndex *indices,LIndex *step_size,size_t vec_size)

{
  LIndex LVar1;
  uint uVar2;
  ulong uVar3;
  
  LVar1 = 0;
  for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < vec_size; uVar2 = uVar2 + 1) {
    LVar1 = LVar1 + step_size[uVar3] * indices[uVar3];
  }
  return LVar1;
}

Assistant:

LIndex IndexTools::IndividualToJointIndicesArrayStepSize(LIndex* indices,
        const LIndex* step_size, size_t vec_size) 
{
    LIndex jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];

    return(jointI);
}